

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O0

int mbedtls_x509_write_names(uchar **p,uchar *start,mbedtls_asn1_named_data *first)

{
  int iVar1;
  mbedtls_asn1_named_data *local_40;
  mbedtls_asn1_named_data *cur;
  size_t len;
  int ret;
  mbedtls_asn1_named_data *first_local;
  uchar *start_local;
  uchar **p_local;
  
  cur = (mbedtls_asn1_named_data *)0x0;
  local_40 = first;
  while( true ) {
    if (local_40 == (mbedtls_asn1_named_data *)0x0) {
      p_local._4_4_ = mbedtls_asn1_write_len(p,start,(size_t)cur);
      if (-1 < p_local._4_4_) {
        iVar1 = p_local._4_4_ + (int)cur;
        p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'0');
        if (-1 < p_local._4_4_) {
          p_local._4_4_ = p_local._4_4_ + iVar1;
        }
      }
      return p_local._4_4_;
    }
    iVar1 = x509_write_name(p,start,(char *)(local_40->oid).p,(local_40->oid).len,(local_40->val).p,
                            (local_40->val).len);
    if (iVar1 < 0) break;
    cur = (mbedtls_asn1_named_data *)((long)&(cur->oid).tag + (long)iVar1);
    local_40 = local_40->next;
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_write_names( unsigned char **p, unsigned char *start,
                      mbedtls_asn1_named_data *first )
{
    int ret;
    size_t len = 0;
    mbedtls_asn1_named_data *cur = first;

    while( cur != NULL )
    {
        MBEDTLS_ASN1_CHK_ADD( len, x509_write_name( p, start, (char *) cur->oid.p,
                                            cur->oid.len,
                                            cur->val.p, cur->val.len ) );
        cur = cur->next;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_CONSTRUCTED |
                                                 MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}